

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void __thiscall
wasm::ModuleUtils::CallGraphPropertyAnalysis<wasm::(anonymous_namespace)::ModuleAnalyzer::Info>::
propagateBack(CallGraphPropertyAnalysis<wasm::(anonymous_namespace)::ModuleAnalyzer::Info> *this,
             function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)> *hasProperty
             ,function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>
              *canHaveProperty,
             function<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&,_wasm::Function_*)>
             *addProperty,NonDirectCalls nonDirectCalls)

{
  bool bVar1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *this_00;
  pointer pFVar2;
  mapped_type *pmVar3;
  set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_> *this_01;
  reference ppFVar4;
  byte local_15b;
  byte local_15a;
  Function *local_128;
  Function *caller;
  iterator __end0;
  iterator __begin0;
  set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_> *__range4;
  Function *func_1;
  pointer local_f8 [3];
  pointer local_e0;
  reference local_d8;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range3;
  UniqueDeferredQueue<wasm::Function_*> work;
  NonDirectCalls nonDirectCalls_local;
  function<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&,_wasm::Function_*)>
  *addProperty_local;
  function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)> *canHaveProperty_local;
  function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)> *hasProperty_local;
  CallGraphPropertyAnalysis<wasm::(anonymous_namespace)::ModuleAnalyzer::Info> *this_local;
  
  work.count._M_h._M_single_bucket._4_4_ = nonDirectCalls;
  UniqueDeferredQueue<wasm::Function_*>::UniqueDeferredQueue
            ((UniqueDeferredQueue<wasm::Function_*> *)&__range3);
  this_00 = &this->wasm->functions;
  __end3 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(this_00);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                     *)&func), bVar1) {
    local_d8 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
               ::operator*(&__end3);
    local_e0 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_d8);
    pmVar3 = std::
             map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
             ::operator[](&this->map,&local_e0);
    bVar1 = std::function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>::
            operator()(hasProperty,pmVar3);
    local_15a = 1;
    if (!bVar1) {
      local_15b = 0;
      if (work.count._M_h._M_single_bucket._4_4_ == NonDirectCallsHaveProperty) {
        local_f8[0] = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                                (local_d8);
        pmVar3 = std::
                 map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                 ::operator[](&this->map,local_f8);
        local_15b = (pmVar3->super_FunctionInfo).hasNonDirectCall;
      }
      local_15a = local_15b;
    }
    if ((local_15a & 1) != 0) {
      func_1 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_d8);
      pmVar3 = std::
               map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
               ::operator[](&this->map,&func_1);
      pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_d8);
      std::function<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&,_wasm::Function_*)>::
      operator()(addProperty,pmVar3,pFVar2);
      pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_d8);
      UniqueDeferredQueue<wasm::Function_*>::push
                ((UniqueDeferredQueue<wasm::Function_*> *)&__range3,pFVar2);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end3);
  }
  while (bVar1 = UniqueDeferredQueue<wasm::Function_*>::empty
                           ((UniqueDeferredQueue<wasm::Function_*> *)&__range3),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __range4 = (set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                *)UniqueDeferredQueue<wasm::Function_*>::pop
                            ((UniqueDeferredQueue<wasm::Function_*> *)&__range3);
    pmVar3 = std::
             map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
             ::operator[](&this->map,(key_type *)&__range4);
    this_01 = &(pmVar3->super_FunctionInfo).calledBy;
    __end0 = std::
             set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>::
             begin(this_01);
    caller = (Function *)
             std::
             set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>::
             end(this_01);
    while (bVar1 = std::operator!=(&__end0,(_Self *)&caller), bVar1) {
      ppFVar4 = std::_Rb_tree_const_iterator<wasm::Function_*>::operator*(&__end0);
      local_128 = *ppFVar4;
      pmVar3 = std::
               map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
               ::operator[](&this->map,&local_128);
      bVar1 = std::function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>::
              operator()(hasProperty,pmVar3);
      if (!bVar1) {
        pmVar3 = std::
                 map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                 ::operator[](&this->map,&local_128);
        bVar1 = std::function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>::
                operator()(canHaveProperty,pmVar3);
        if (bVar1) {
          pmVar3 = std::
                   map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                   ::operator[](&this->map,&local_128);
          std::
          function<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&,_wasm::Function_*)>::
          operator()(addProperty,pmVar3,(Function *)__range4);
          UniqueDeferredQueue<wasm::Function_*>::push
                    ((UniqueDeferredQueue<wasm::Function_*> *)&__range3,local_128);
        }
      }
      std::_Rb_tree_const_iterator<wasm::Function_*>::operator++(&__end0);
    }
  }
  UniqueDeferredQueue<wasm::Function_*>::~UniqueDeferredQueue
            ((UniqueDeferredQueue<wasm::Function_*> *)&__range3);
  return;
}

Assistant:

void propagateBack(std::function<bool(const T&)> hasProperty,
                     std::function<bool(const T&)> canHaveProperty,
                     std::function<void(T&, Function*)> addProperty,
                     NonDirectCalls nonDirectCalls) {
    // The work queue contains items we just learned can change the state.
    UniqueDeferredQueue<Function*> work;
    for (auto& func : wasm.functions) {
      if (hasProperty(map[func.get()]) ||
          (nonDirectCalls == NonDirectCallsHaveProperty &&
           map[func.get()].hasNonDirectCall)) {
        addProperty(map[func.get()], func.get());
        work.push(func.get());
      }
    }
    while (!work.empty()) {
      auto* func = work.pop();
      for (auto* caller : map[func].calledBy) {
        // If we don't already have the property, and we are not forbidden
        // from getting it, then it propagates back to us now.
        if (!hasProperty(map[caller]) && canHaveProperty(map[caller])) {
          addProperty(map[caller], func);
          work.push(caller);
        }
      }
    }
  }